

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_security_factory.c
# Opt level: O0

int iothub_security_init(IOTHUB_SECURITY_TYPE sec_type)

{
  SECURE_DEVICE_TYPE hsm_type;
  SECURE_DEVICE_TYPE SVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  SECURE_DEVICE_TYPE security_device_type_from_prov;
  LOGGER_LOG l;
  int local_18;
  SECURE_DEVICE_TYPE secure_device_type_from_caller;
  int result;
  IOTHUB_SECURITY_TYPE sec_type_local;
  
  hsm_type = get_secure_device_type(sec_type);
  if (hsm_type == SECURE_DEVICE_TYPE_UNKNOWN) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_security_factory.c"
                ,"iothub_security_init",0x3e,1,"Security type %d is not supported in this SDK build"
                ,sec_type);
    }
    local_18 = 0x3f;
  }
  else {
    g_security_type = sec_type;
    SVar1 = prov_dev_security_get_type();
    if (SVar1 == SECURE_DEVICE_TYPE_UNKNOWN) {
      local_18 = prov_dev_security_init(hsm_type);
    }
    else if (hsm_type == SVar1) {
      local_18 = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_security_factory.c"
                  ,"iothub_security_init",0x4b,1,
                  "Security type from caller %d (which maps to security device type %d) does not match already specified security device type %d"
                  ,sec_type,hsm_type,SVar1);
      }
      local_18 = 0x4c;
    }
    if (local_18 == 0) {
      local_18 = initialize_hsm_system();
    }
  }
  return local_18;
}

Assistant:

int iothub_security_init(IOTHUB_SECURITY_TYPE sec_type)
{
    int result;

    SECURE_DEVICE_TYPE secure_device_type_from_caller = get_secure_device_type(sec_type);

    if (secure_device_type_from_caller == SECURE_DEVICE_TYPE_UNKNOWN)
    {
        LogError("Security type %d is not supported in this SDK build", sec_type);
        result = MU_FAILURE;
    }
    else
    {
        g_security_type = sec_type;
        SECURE_DEVICE_TYPE security_device_type_from_prov = prov_dev_security_get_type();
        if (security_device_type_from_prov == SECURE_DEVICE_TYPE_UNKNOWN)
        {
            result = prov_dev_security_init(secure_device_type_from_caller);
        }
        else if (secure_device_type_from_caller != security_device_type_from_prov)
        {
            LogError("Security type from caller %d (which maps to security device type %d) does not match already specified security device type %d", sec_type, secure_device_type_from_caller, security_device_type_from_prov);
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }

        if (result == 0)
        {
            result = initialize_hsm_system();
        }
    }
    return result;
}